

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O3

void __thiscall
LiteScript::_Type_CLASS::GarbageCollector
          (_Type_CLASS *this,Variable *object,offset_in_Memory_to_subr caller)

{
  Class *this_00;
  char cVar1;
  uint uVar2;
  Object *pOVar3;
  long in_RCX;
  ulong uVar4;
  uint i;
  int iVar5;
  uint i_00;
  uint uVar6;
  long *plVar7;
  long lVar8;
  code *pcVar9;
  pointer local_38;
  
  pOVar3 = Variable::operator->(object);
  plVar7 = (long *)((long)(pOVar3->memory->arr)._M_elems + in_RCX);
  pcVar9 = (code *)caller;
  if ((caller & 1) != 0) {
    pcVar9 = *(code **)(*plVar7 + -1 + caller);
  }
  pOVar3 = Variable::operator->(object);
  cVar1 = (*pcVar9)(plVar7,pOVar3->ID);
  if (cVar1 == '\0') {
    pOVar3 = Variable::operator->(object);
    this_00 = (Class *)pOVar3->data;
    local_38 = (pointer)Class::GetInherits(this_00);
    uVar4 = (ulong)((long)local_38->nb_ref -
                   (long)(((_Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                            *)&local_38->obj)->_M_impl).super__Vector_impl_data._M_start) >> 4;
    if ((int)uVar4 != 0) {
      uVar4 = uVar4 & 0xffffffff;
      lVar8 = 0;
      do {
        Variable::Variable((Variable *)&stack0xffffffffffffffb8,
                           (Variable *)
                           ((long)&((((_Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                       *)&local_38->obj)->_M_impl).super__Vector_impl_data._M_start)
                                   ->obj + lVar8));
        Variable::GarbageCollector((Variable *)&stack0xffffffffffffffb8,caller);
        Variable::~Variable((Variable *)&stack0xffffffffffffffb8);
        lVar8 = lVar8 + 0x10;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    uVar2 = Class::GetStaticCount(this_00);
    i_00 = (uint)this_00;
    if (uVar2 != 0) {
      uVar6 = 0;
      do {
        Class::GetStaticMember((Class *)&stack0xffffffffffffffb8,i_00);
        Variable::GarbageCollector((Variable *)&stack0xffffffffffffffb8,caller);
        Variable::~Variable((Variable *)&stack0xffffffffffffffb8);
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
    }
    uVar2 = Class::GetUnstaticCount(this_00);
    if (uVar2 != 0) {
      uVar6 = 0;
      do {
        Class::GetUnstaticMember((Class *)&stack0xffffffffffffffb8,i_00);
        Variable::GarbageCollector((Variable *)&stack0xffffffffffffffb8,caller);
        Variable::~Variable((Variable *)&stack0xffffffffffffffb8);
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
    }
    iVar5 = 0;
    do {
      Class::GetOperator((Class *)&stack0xffffffffffffffb8,i_00);
      Variable::GarbageCollector((Variable *)&stack0xffffffffffffffb8,caller);
      Variable::~Variable((Variable *)&stack0xffffffffffffffb8);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0x21);
  }
  return;
}

Assistant:

void LiteScript::_Type_CLASS::GarbageCollector(const Variable &object, bool (Memory::*caller)(unsigned int)) const {
    if ((object->memory.*caller)(object->ID))
        return;
    const Class& C = object->GetData<Class>();
    const std::vector<LiteScript::Variable>& inherits = C.GetInherits();
    for (unsigned int i = 0, sz = inherits.size(); i < sz; i++)
        Variable(inherits[i]).GarbageCollector(caller);
    for (unsigned int i = 0, sz = C.GetStaticCount(); i < sz; i++)
        C.GetStaticMember(i).GarbageCollector(caller);
    for (unsigned int i = 0, sz = C.GetUnstaticCount(); i < sz; i++)
        C.GetUnstaticMember(i).GarbageCollector(caller);
    for (unsigned int i = 0, sz = Class::OperatorType::OP_TYPE_NUMBER; i < sz; i++)
        C.GetOperator(i).GarbageCollector(caller);
}